

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O1

void __thiscall caffe::DummyDataParameter::DummyDataParameter(DummyDataParameter *this)

{
  (this->super_Message).super_MessageLite._vptr_MessageLite =
       (_func_int **)&PTR__DummyDataParameter_0071d4b0;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
  .ptr_ = (void *)0x0;
  (this->_has_bits_).has_bits_[0] = 0;
  (this->data_filler_).super_RepeatedPtrFieldBase.arena_ = (Arena *)0x0;
  (this->data_filler_).super_RepeatedPtrFieldBase.current_size_ = 0;
  (this->data_filler_).super_RepeatedPtrFieldBase.total_size_ = 0;
  (this->data_filler_).super_RepeatedPtrFieldBase.rep_ = (Rep *)0x0;
  (this->num_).current_size_ = 0;
  (this->num_).total_size_ = 0;
  (this->num_).rep_ = (Rep *)0x0;
  (this->channels_).current_size_ = 0;
  (this->channels_).total_size_ = 0;
  (this->channels_).rep_ = (Rep *)0x0;
  (this->height_).current_size_ = 0;
  (this->height_).total_size_ = 0;
  (this->height_).rep_ = (Rep *)0x0;
  (this->width_).current_size_ = 0;
  (this->width_).total_size_ = 0;
  (this->width_).rep_ = (Rep *)0x0;
  (this->shape_).super_RepeatedPtrFieldBase.arena_ = (Arena *)0x0;
  (this->shape_).super_RepeatedPtrFieldBase.current_size_ = 0;
  (this->shape_).super_RepeatedPtrFieldBase.total_size_ = 0;
  (this->shape_).super_RepeatedPtrFieldBase.rep_ = (Rep *)0x0;
  if (this != (DummyDataParameter *)&_DummyDataParameter_default_instance_) {
    protobuf_caffe_2eproto::InitDefaults();
  }
  this->_cached_size_ = 0;
  return;
}

Assistant:

DummyDataParameter::DummyDataParameter()
  : ::google::protobuf::Message(), _internal_metadata_(NULL) {
  if (GOOGLE_PREDICT_TRUE(this != internal_default_instance())) {
    protobuf_caffe_2eproto::InitDefaults();
  }
  SharedCtor();
  // @@protoc_insertion_point(constructor:caffe.DummyDataParameter)
}